

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O3

bool __thiscall
spvtools::Optimizer::Run
          (Optimizer *this,uint32_t *original_binary,size_t original_binary_size,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *optimized_binary,
          spv_optimizer_options opt_options)

{
  spv_target_env env;
  _Head_base<0UL,_spvtools::Optimizer::Impl_*,_false> _Var1;
  _Manager_type p_Var2;
  Module *this_00;
  pointer puVar3;
  bool bVar4;
  Status SVar5;
  int iVar6;
  unique_ptr<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>_> context;
  SpirvTools tools;
  vector<unsigned_int,_std::allocator<unsigned_int>_> optimized_binary_with_nop;
  _Head_base<0UL,_spvtools::opt::IRContext_*,_false> local_a8;
  SpirvTools local_a0;
  uint32_t *local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_90;
  _Any_data local_88;
  _Manager_type local_78;
  _Invoker_type p_Stack_70;
  _Any_data local_68;
  _Manager_type local_58;
  _Invoker_type p_Stack_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_90 = optimized_binary;
  SpirvTools::SpirvTools
            (&local_a0,
             ((this->impl_)._M_t.
              super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
              .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl)->target_env);
  _Var1._M_head_impl =
       (this->impl_)._M_t.
       super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
       .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl;
  local_58 = (_Manager_type)0x0;
  p_Stack_50 = (_Invoker_type)0x0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  p_Var2 = *(_Manager_type *)((long)&(_Var1._M_head_impl)->pass_manager + 0x10);
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)(&local_68,(_Any_data *)&(_Var1._M_head_impl)->pass_manager,2);
    local_58 = *(_Manager_type *)((long)&(_Var1._M_head_impl)->pass_manager + 0x10);
    p_Stack_50 = *(_Invoker_type *)((long)&(_Var1._M_head_impl)->pass_manager + 0x18);
  }
  SpirvTools::SetMessageConsumer(&local_a0,(MessageConsumer *)&local_68);
  if (local_58 != (_Manager_type)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  if (opt_options->run_validator_ == true) {
    bVar4 = SpirvTools::Validate
                      (&local_a0,original_binary,original_binary_size,&opt_options->val_options_);
    if (!bVar4) {
      bVar4 = false;
      goto LAB_0052252a;
    }
  }
  _Var1._M_head_impl =
       (this->impl_)._M_t.
       super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
       .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl;
  env = (_Var1._M_head_impl)->target_env;
  local_78 = (_Manager_type)0x0;
  p_Stack_70 = (_Invoker_type)0x0;
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  p_Var2 = *(_Manager_type *)((long)&(_Var1._M_head_impl)->pass_manager + 0x10);
  local_98 = original_binary;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)(&local_88,(_Any_data *)&(_Var1._M_head_impl)->pass_manager,2);
    local_78 = *(_Manager_type *)((long)&(_Var1._M_head_impl)->pass_manager + 0x10);
    p_Stack_70 = *(_Invoker_type *)((long)&(_Var1._M_head_impl)->pass_manager + 0x18);
  }
  BuildModule((spvtools *)&local_a8,env,(MessageConsumer *)&local_88,local_98,original_binary_size);
  if (local_78 != (_Manager_type)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  if (local_a8._M_head_impl == (IRContext *)0x0) {
LAB_0052251c:
    bVar4 = false;
  }
  else {
    (local_a8._M_head_impl)->max_id_bound_ = opt_options->max_id_bound_;
    (local_a8._M_head_impl)->preserve_bindings_ = opt_options->preserve_bindings_;
    (local_a8._M_head_impl)->preserve_spec_constants_ = opt_options->preserve_spec_constants_;
    *(spv_validator_options_t **)
     ((long)&((this->impl_)._M_t.
              super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
              .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl)->pass_manager
     + 0x50) = &opt_options->val_options_;
    _Var1._M_head_impl =
         (this->impl_)._M_t.
         super___uniq_ptr_impl<spvtools::Optimizer::Impl,_std::default_delete<spvtools::Optimizer::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_spvtools::Optimizer::Impl_*,_std::default_delete<spvtools::Optimizer::Impl>_>
         .super__Head_base<0UL,_spvtools::Optimizer::Impl_*,_false>._M_head_impl;
    *(spv_target_env *)((long)&(_Var1._M_head_impl)->pass_manager + 0x48) =
         (_Var1._M_head_impl)->target_env;
    SVar5 = opt::PassManager::Run(&(_Var1._M_head_impl)->pass_manager,local_a8._M_head_impl);
    if (SVar5 == Failure) goto LAB_0052251c;
    if ((SVar5 == SuccessWithoutChange) &&
       (this_00 = ((local_a8._M_head_impl)->module_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                  .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl,
       this_00->contains_debug_info_ == false)) {
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (uint32_t *)0x0;
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      opt::Module::ToBinary(this_00,&local_48,false);
      puVar3 = local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2 != original_binary_size) {
        __assert_fail("optimized_binary_with_nop.size() == original_binary_size && \"Binary size unexpectedly changed despite the optimizer saying \" \"there was no change\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/optimizer.cpp"
                      ,0x2cb,
                      "bool spvtools::Optimizer::Run(const uint32_t *, const size_t, std::vector<uint32_t> *, const spv_optimizer_options) const"
                     );
      }
      if (*local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start == *local_98) {
        iVar6 = bcmp(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start,local_98,original_binary_size);
        if (iVar6 != 0) {
          __assert_fail("memcmp(optimized_binary_with_nop.data(), original_binary, original_binary_size) == 0 && \"Binary content unexpectedly changed despite the optimizer saying \" \"there was no change\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/optimizer.cpp"
                        ,0x2d4,
                        "bool spvtools::Optimizer::Run(const uint32_t *, const size_t, std::vector<uint32_t> *, const spv_optimizer_options) const"
                       );
        }
      }
      operator_delete(puVar3,(long)local_48.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar3)
      ;
    }
    puVar3 = (local_90->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((local_90->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar3) {
      (local_90->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish = puVar3;
    }
    opt::Module::ToBinary
              (((local_a8._M_head_impl)->module_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
               .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl,local_90,true);
    bVar4 = true;
  }
  std::unique_ptr<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>_>::
  ~unique_ptr((unique_ptr<spvtools::opt::IRContext,_std::default_delete<spvtools::opt::IRContext>_>
               *)&local_a8);
LAB_0052252a:
  SpirvTools::~SpirvTools(&local_a0);
  return bVar4;
}

Assistant:

bool Optimizer::Run(const uint32_t* original_binary,
                    const size_t original_binary_size,
                    std::vector<uint32_t>* optimized_binary,
                    const spv_optimizer_options opt_options) const {
  spvtools::SpirvTools tools(impl_->target_env);
  tools.SetMessageConsumer(impl_->pass_manager.consumer());
  if (opt_options->run_validator_ &&
      !tools.Validate(original_binary, original_binary_size,
                      &opt_options->val_options_)) {
    return false;
  }

  std::unique_ptr<opt::IRContext> context = BuildModule(
      impl_->target_env, consumer(), original_binary, original_binary_size);
  if (context == nullptr) return false;

  context->set_max_id_bound(opt_options->max_id_bound_);
  context->set_preserve_bindings(opt_options->preserve_bindings_);
  context->set_preserve_spec_constants(opt_options->preserve_spec_constants_);

  impl_->pass_manager.SetValidatorOptions(&opt_options->val_options_);
  impl_->pass_manager.SetTargetEnv(impl_->target_env);
  auto status = impl_->pass_manager.Run(context.get());

  if (status == opt::Pass::Status::Failure) {
    return false;
  }

#ifndef NDEBUG
  // We do not keep the result id of DebugScope in struct DebugScope.
  // Instead, we assign random ids for them, which results in integrity
  // check failures. In addition, propagating the OpLine/OpNoLine to preserve
  // the debug information through transformations results in integrity
  // check failures. We want to skip the integrity check when the module
  // contains DebugScope or OpLine/OpNoLine instructions.
  if (status == opt::Pass::Status::SuccessWithoutChange &&
      !context->module()->ContainsDebugInfo()) {
    std::vector<uint32_t> optimized_binary_with_nop;
    context->module()->ToBinary(&optimized_binary_with_nop,
                                /* skip_nop = */ false);
    assert(optimized_binary_with_nop.size() == original_binary_size &&
           "Binary size unexpectedly changed despite the optimizer saying "
           "there was no change");

    // Compare the magic number to make sure the binaries were encoded in the
    // endianness.  If not, the contents of the binaries will be different, so
    // do not check the contents.
    if (optimized_binary_with_nop[0] == original_binary[0]) {
      assert(memcmp(optimized_binary_with_nop.data(), original_binary,
                    original_binary_size) == 0 &&
             "Binary content unexpectedly changed despite the optimizer saying "
             "there was no change");
    }
  }
#endif  // !NDEBUG

  // Note that |original_binary| and |optimized_binary| may share the same
  // buffer and the below will invalidate |original_binary|.
  optimized_binary->clear();
  context->module()->ToBinary(optimized_binary, /* skip_nop = */ true);

  return true;
}